

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O3

ssize_t serialize::write(int __fd,void *__buf,size_t __n)

{
  undefined8 uVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n_00;
  undefined1 *__buf_00;
  int __fd_00;
  undefined4 in_register_0000003c;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  undefined1 local_24 [8];
  uint32_t size;
  
  pcVar2 = (char *)CONCAT44(in_register_0000003c,__fd);
  if (LE()::le == '\0') {
    write(__fd,__buf,__n);
  }
  if (LE()::le == '\0') {
    lVar6 = 3;
    do {
      __buf_00 = local_24 + lVar6;
      pcVar3 = pcVar2;
      std::ostream::write(pcVar2,(long)__buf_00);
      __fd_00 = (int)pcVar3;
      bVar7 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      __n_00 = extraout_RDX_00;
    } while (bVar7);
  }
  else {
    __buf_00 = local_24;
    pcVar3 = pcVar2;
    std::ostream::write(pcVar2,(long)__buf_00);
    __fd_00 = (int)pcVar3;
    __n_00 = extraout_RDX;
  }
  lVar6 = *__buf;
  uVar1 = *(undefined8 *)((long)__buf + 8);
  if (LE()::le == '\0') {
    write(__fd_00,__buf_00,__n_00);
  }
  if (LE()::le == '\0') {
    uVar4 = (int)uVar1 - 1;
    if (-1 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
      do {
        std::ostream::write(pcVar2,lVar6 + uVar5);
        bVar7 = uVar5 != 0;
        uVar5 = uVar5 - 1;
      } while (bVar7);
    }
  }
  else {
    std::ostream::write(pcVar2,lVar6);
  }
  return (ssize_t)pcVar2;
}

Assistant:

static inline ostream& write (ostream& ostream_, const std::string& string_)
    {
        uint32_t size = string_.size();
        write (ostream_, size);
        write_internal (ostream_, string_.c_str(), string_.size());
        return ostream_;
    }